

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaeger_types.cpp
# Opt level: O1

void __thiscall jaegertracing::thrift::Tag::printTo(Tag *this,ostream *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Tag__isset _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_01;
  char *local_220;
  long local_218;
  char local_210 [16];
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0 [3];
  ios_base local_130 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"Tag(",4);
  std::__ostream_insert<char,std::char_traits<char>>(out,"key=",4);
  apache::thrift::to_string<std::__cxx11::string>(local_1a0,(thrift *)&this->key,t);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_1a0[0]._M_dataplus._M_p,local_1a0[0]._M_string_length);
  paVar1 = &local_1a0[0].field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0[0]._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"vType=",6);
  apache::thrift::to_string<jaegertracing::thrift::TagType::type>(local_1a0,&this->vType);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_1a0[0]._M_dataplus._M_p,local_1a0[0]._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0[0]._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"vStr=",5);
  _Var2 = this->__isset;
  if (((byte)_Var2 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    apache::thrift::to_string<std::__cxx11::string>(&local_1c0,(thrift *)&this->vStr,t_00);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  }
  if ((((byte)_Var2 & 1) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2)) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"vDouble=",8);
  _Var2 = this->__isset;
  if (((byte)_Var2 & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    *(undefined8 *)
     ((long)&local_1a0[0]._M_string_length + *(long *)(local_1a0[0]._M_dataplus._M_p + -0x18)) =
         0x11;
    std::ostream::_M_insert<double>(this->vDouble);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base(local_130);
    std::__ostream_insert<char,std::char_traits<char>>(out,local_220,local_218);
  }
  if ((((byte)_Var2 & 2) != 0) && (local_220 != local_210)) {
    operator_delete(local_220);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"vBool=",6);
  _Var2 = this->__isset;
  if (((byte)_Var2 & 4) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    apache::thrift::to_string<bool>(local_1a0,&this->vBool);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_1a0[0]._M_dataplus._M_p,local_1a0[0]._M_string_length);
  }
  if ((((byte)_Var2 & 4) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0[0]._M_dataplus._M_p != paVar1)) {
    operator_delete(local_1a0[0]._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"vLong=",6);
  _Var2 = this->__isset;
  if (((byte)_Var2 & 8) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    apache::thrift::to_string<long>(&local_1e0,&this->vLong);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  }
  if ((((byte)_Var2 & 8) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2)) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"vBinary=",8);
  _Var2 = this->__isset;
  if (((byte)_Var2 & 0x10) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    apache::thrift::to_string<std::__cxx11::string>(&local_200,(thrift *)&this->vBinary,t_01);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_200._M_dataplus._M_p,local_200._M_string_length);
  }
  if ((((byte)_Var2 & 0x10) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2)) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  return;
}

Assistant:

void Tag::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "Tag(";
  out << "key=" << to_string(key);
  out << ", " << "vType=" << to_string(vType);
  out << ", " << "vStr="; (__isset.vStr ? (out << to_string(vStr)) : (out << "<null>"));
  out << ", " << "vDouble="; (__isset.vDouble ? (out << to_string(vDouble)) : (out << "<null>"));
  out << ", " << "vBool="; (__isset.vBool ? (out << to_string(vBool)) : (out << "<null>"));
  out << ", " << "vLong="; (__isset.vLong ? (out << to_string(vLong)) : (out << "<null>"));
  out << ", " << "vBinary="; (__isset.vBinary ? (out << to_string(vBinary)) : (out << "<null>"));
  out << ")";
}